

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  CallInfo *pCVar1;
  StkId pTVar2;
  StkId pTVar3;
  int iVar4;
  undefined4 uVar5;
  char *pcVar6;
  StkId pos;
  StkId local_10;
  
  if (L->status == '\x01') {
    pCVar1 = L->ci;
    pTVar2 = L->stack;
    pTVar3 = pCVar1->func;
    pCVar1->func = (StkId)((long)&pTVar2->value_ + pCVar1->extra);
    pCVar1->extra = (long)pTVar3 - (long)pTVar2;
  }
  if (ar == (lua_Debug *)0x0) {
    if (L->top[-1].tt_ == 0x46) {
      pcVar6 = luaF_getlocalname(*(Proto **)(L->top[-1].value_.f + 0x18),n,0);
    }
    else {
      pcVar6 = (char *)0x0;
    }
  }
  else {
    local_10 = (StkId)0x0;
    pcVar6 = findlocal(L,ar->i_ci,n,&local_10);
    if (pcVar6 != (char *)0x0) {
      pTVar2 = L->top;
      iVar4 = local_10->tt_;
      uVar5 = *(undefined4 *)&local_10->field_0xc;
      pTVar2->value_ = local_10->value_;
      pTVar2->tt_ = iVar4;
      *(undefined4 *)&pTVar2->field_0xc = uVar5;
      L->top = L->top + 1;
    }
  }
  if (L->status == '\x01') {
    pCVar1 = L->ci;
    pTVar2 = L->stack;
    pTVar3 = pCVar1->func;
    pCVar1->func = (StkId)((long)&pTVar2->value_ + pCVar1->extra);
    pCVar1->extra = (long)pTVar3 - (long)pTVar2;
  }
  return pcVar6;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n) {
    const char *name;
    lua_lock(L);
    swapextra(L);
    if (ar == NULL) {  /* information about non-active function? */
        if (!isLfunction(L->top - 1))  /* not a Lua function? */
            name = NULL;
        else  /* consider live variables at function start (parameters) */
            name = luaF_getlocalname(clLvalue(L->top - 1)->p, n, 0);
    } else {  /* active function; get information through 'ar' */
        StkId pos = NULL;  /* to avoid warnings */
        name = findlocal(L, ar->i_ci, n, &pos);
        if (name) {
            setobj2s(L, L->top, pos);
            api_incr_top(L);
        }
    }
    swapextra(L);
    lua_unlock(L);
    return name;
}